

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_data.cpp
# Opt level: O3

StreamExecutionResult __thiscall
duckdb::BufferedData::ReplenishBuffer
          (BufferedData *this,StreamQueryResult *result,ClientContextLock *context_lock)

{
  bool bVar1;
  int iVar2;
  ClientContext *this_00;
  StreamExecutionResult result_00;
  shared_ptr<duckdb::ClientContext,_true> cc;
  shared_ptr<duckdb::ClientContext,_true> local_40;
  
  weak_ptr<duckdb::ClientContext,_true>::lock((weak_ptr<duckdb::ClientContext,_true> *)&local_40);
  if (local_40.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    result_00 = EXECUTION_CANCELLED;
  }
  else {
    while( true ) {
      iVar2 = (*this->_vptr_BufferedData[2])(this,result,context_lock);
      result_00 = (StreamExecutionResult)iVar2;
      bVar1 = StreamQueryResult::IsChunkReady(result_00);
      if (bVar1) break;
      if (result_00 == BLOCKED) {
        (*this->_vptr_BufferedData[4])(this);
        this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->(&local_40);
        ClientContext::WaitForTask(this_00,context_lock,(BaseQueryResult *)result);
      }
    }
    bVar1 = BaseQueryResult::HasError((BaseQueryResult *)result);
    if (bVar1) {
      ::std::__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> *)&this->context);
    }
  }
  if (local_40.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.internal.
               super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return result_00;
}

Assistant:

StreamExecutionResult BufferedData::ReplenishBuffer(StreamQueryResult &result, ClientContextLock &context_lock) {
	auto cc = context.lock();
	if (!cc) {
		return StreamExecutionResult::EXECUTION_CANCELLED;
	}

	StreamExecutionResult execution_result;
	while (!StreamQueryResult::IsChunkReady(execution_result = ExecuteTaskInternal(result, context_lock))) {
		if (execution_result == StreamExecutionResult::BLOCKED) {
			UnblockSinks();
			cc->WaitForTask(context_lock, result);
		}
	}
	if (result.HasError()) {
		Close();
	}
	return execution_result;
}